

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_def_io.c
# Opt level: O2

int32 model_def_free(model_def_t *mdef)

{
  char **ppcVar1;
  ulong uVar2;
  acmod_set_t *ptr;
  model_def_entry_t *ptr_00;
  ulong uVar3;
  
  ptr = mdef->acmod_set;
  if (ptr == (acmod_set_t *)0x0) {
    ptr = (acmod_set_t *)0x0;
  }
  else {
    if (ptr->ci != (ci_acmod_t *)0x0) {
      for (uVar3 = 0; uVar3 < ptr->n_ci; uVar3 = uVar3 + 1) {
        ckd_free(ptr->ci[uVar3].name);
        ptr = mdef->acmod_set;
        ppcVar1 = ptr->ci[uVar3].attrib;
        if (ppcVar1 != (char **)0x0) {
          uVar2 = 0;
          while( true ) {
            if (ppcVar1[uVar2] == (char *)0x0) break;
            ckd_free(ppcVar1[uVar2]);
            uVar2 = (ulong)((int)uVar2 + 1);
            ppcVar1 = mdef->acmod_set->ci[uVar3].attrib;
          }
          ckd_free(ppcVar1);
          ptr = mdef->acmod_set;
        }
      }
      ckd_free(ptr->ci);
      ptr = mdef->acmod_set;
    }
    ptr->ci = (ci_acmod_t *)0x0;
    if (ptr->multi != (acmod_t *)0x0) {
      for (uVar3 = 0; uVar3 < ptr->n_multi; uVar3 = uVar3 + 1) {
        ppcVar1 = ptr->multi[uVar3].attrib;
        if (ppcVar1 != (char **)0x0) {
          uVar2 = 0;
          while( true ) {
            if (ppcVar1[uVar2] == (char *)0x0) break;
            ckd_free(ppcVar1[uVar2]);
            uVar2 = (ulong)((int)uVar2 + 1);
            ppcVar1 = mdef->acmod_set->multi[uVar3].attrib;
          }
          ckd_free(ppcVar1);
          ptr = mdef->acmod_set;
        }
      }
      ckd_free(ptr->multi);
      ptr = mdef->acmod_set;
    }
    ptr->multi = (acmod_t *)0x0;
    if (ptr->multi_idx != (itree_t **)0x0) {
      for (uVar3 = 0; uVar3 < ptr->n_ci; uVar3 = uVar3 + 1) {
        ckd_free(ptr->multi_idx[uVar3]->cell);
        ckd_free(mdef->acmod_set->multi_idx[uVar3]);
        ptr = mdef->acmod_set;
      }
      ckd_free(ptr->multi_idx);
      ptr = mdef->acmod_set;
    }
    ptr->multi_idx = (itree_t **)0x0;
    ppcVar1 = ptr->attrib;
    if (ppcVar1 != (char **)0x0) {
      uVar3 = 0;
      while( true ) {
        if (ppcVar1[uVar3] == (char *)0x0) break;
        ckd_free(ppcVar1[uVar3]);
        uVar3 = (ulong)((int)uVar3 + 1);
        ppcVar1 = mdef->acmod_set->attrib;
      }
      ckd_free(ppcVar1);
      ptr = mdef->acmod_set;
    }
    ptr->attrib = (char **)0x0;
    if (ptr->n_with != (uint32 *)0x0) {
      ckd_free(ptr->n_with);
      ptr = mdef->acmod_set;
    }
    ptr->n_with = (uint32 *)0x0;
  }
  ckd_free(ptr);
  mdef->acmod_set = (acmod_set_t *)0x0;
  if (mdef->defn == (model_def_entry_t *)0x0) {
    ptr_00 = (model_def_entry_t *)0x0;
  }
  else {
    ckd_free(mdef->defn->state);
    for (uVar3 = 0; ptr_00 = mdef->defn, uVar3 < mdef->n_defn; uVar3 = uVar3 + 1) {
      ppcVar1 = ptr_00[uVar3].attrib;
      if (ppcVar1 != (char **)0x0) {
        uVar2 = 0;
        while( true ) {
          if (ppcVar1[uVar2] == (char *)0x0) break;
          ckd_free(ppcVar1[uVar2]);
          uVar2 = (ulong)((int)uVar2 + 1);
          ppcVar1 = mdef->defn[uVar3].attrib;
        }
        ckd_free(ppcVar1);
      }
    }
  }
  ckd_free(ptr_00);
  mdef->defn = (model_def_entry_t *)0x0;
  if (mdef->cb != (uint32 *)0x0) {
    ckd_free(mdef->cb);
  }
  mdef->cb = (uint32 *)0x0;
  if (mdef->ts2ci != (acmod_id_t *)0x0) {
    ckd_free(mdef->ts2ci);
  }
  mdef->ts2ci = (acmod_id_t *)0x0;
  ckd_free(mdef);
  return 0;
}

Assistant:

int32
model_def_free(model_def_t *mdef)
{
  uint32 i;
  uint32 len;

  if (mdef->acmod_set) {
    if (mdef->acmod_set->ci) {
      for (i = 0; i < mdef->acmod_set->n_ci; i++) {
	ckd_free(mdef->acmod_set->ci[i].name);
	if (mdef->acmod_set->ci[i].attrib) {
	  for (len = 0; mdef->acmod_set->ci[i].attrib[len]; len++)
    	     ckd_free(mdef->acmod_set->ci[i].attrib[len]);
	  ckd_free(mdef->acmod_set->ci[i].attrib);
	}
      }
      ckd_free(mdef->acmod_set->ci);
    }
    mdef->acmod_set->ci = NULL;

    if (mdef->acmod_set->multi) {
      for (i = 0; i < mdef->acmod_set->n_multi; i ++) {
	if (mdef->acmod_set->multi[i].attrib) {
	  for (len = 0; mdef->acmod_set->multi[i].attrib[len]; len++)
	     ckd_free(mdef->acmod_set->multi[i].attrib[len]);
	  ckd_free(mdef->acmod_set->multi[i].attrib);
	}
      }
      ckd_free(mdef->acmod_set->multi);
    }
    mdef->acmod_set->multi = NULL;

    if (mdef->acmod_set->multi_idx) {
      for (i = 0; i < mdef->acmod_set->n_ci; i++) {
	ckd_free(mdef->acmod_set->multi_idx[i]->cell);
	ckd_free(mdef->acmod_set->multi_idx[i]);
      }
      ckd_free(mdef->acmod_set->multi_idx);
    }
    mdef->acmod_set->multi_idx = NULL;

    if (mdef->acmod_set->attrib) {
      for (len = 0; mdef->acmod_set->attrib[len]; len++)
	  ckd_free(mdef->acmod_set->attrib[len]);
      ckd_free(mdef->acmod_set->attrib);
    }
    mdef->acmod_set->attrib = NULL;

    if (mdef->acmod_set->n_with)
      ckd_free(mdef->acmod_set->n_with);
    mdef->acmod_set->n_with = NULL;
  }
  ckd_free(mdef->acmod_set);
  mdef->acmod_set = NULL;

  if (mdef->defn) {
    ckd_free(mdef->defn->state);
    for (i = 0; i < mdef->n_defn; i++) {
      if (mdef->defn[i].attrib) {
	for (len = 0; mdef->defn[i].attrib[len]; len++)
	    ckd_free(mdef->defn[i].attrib[len]);
	ckd_free(mdef->defn[i].attrib);
      }
    }
  }
  ckd_free(mdef->defn);
  mdef->defn = NULL;

  if (mdef->cb)
    ckd_free(mdef->cb);
  mdef->cb = NULL;

  if (mdef->ts2ci)
    ckd_free(mdef->ts2ci);
  mdef->ts2ci = NULL;

  ckd_free(mdef);
  mdef = NULL;

  return S3_SUCCESS;
}